

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestCaseTracking::TrackerBase::fail(TrackerBase *this)

{
  TrackerContext *pTVar1;
  
  this->m_runState = Failed;
  if (this->m_parent != (ITracker *)0x0) {
    (*(this->m_parent->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
      _vptr_NonCopyable[0xc])();
  }
  if (this->m_parent != (ITracker *)0x0) {
    pTVar1 = this->m_ctx;
    pTVar1->m_currentTracker = this->m_parent;
    pTVar1->m_runState = CompletedCycle;
    return;
  }
  __assert_fail("m_parent",
                "/workspace/llm4binary/github/license_c_cmakelists/duckie[P]named_types/3rdparty/catch/catch.hpp"
                ,0x163c,"void Catch::TestCaseTracking::TrackerBase::moveToParent()");
}

Assistant:

virtual void fail() CATCH_OVERRIDE {
            m_runState = Failed;
            if( m_parent )
                m_parent->markAsNeedingAnotherRun();
            moveToParent();
            m_ctx.completeCycle();
        }